

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxerManager.cpp
# Opt level: O2

void __thiscall
MuxerManager::asyncWriteBuffer
          (MuxerManager *this,AbstractMuxer *muxer,uint8_t *buff,int len,
          AbstractOutputStream *dstFile)

{
  value_type local_20;
  
  local_20.m_command = wdWrite;
  local_20.m_buffer = buff;
  local_20.m_bufferLen = len;
  local_20.m_mainFile = dstFile;
  if ((this->m_interleave == true) && (this->m_mainMuxer == muxer)) {
    std::vector<WriterData,_std::allocator<WriterData>_>::push_back(&this->m_delayedData,&local_20);
  }
  else {
    asyncWriteBlock(this,&local_20);
  }
  return;
}

Assistant:

void MuxerManager::asyncWriteBuffer(const AbstractMuxer* muxer, uint8_t* buff, const int len,
                                    AbstractOutputStream* dstFile)
{
    WriterData data;
    data.m_buffer = buff;
    data.m_bufferLen = len;
    data.m_mainFile = dstFile;
    data.m_command = WriterData::Commands::wdWrite;

    if (m_interleave && muxer == m_mainMuxer)
    {
        // do interleave of SSIF blocks. Place sub channel blocks first, delay main muxer blocks
        m_delayedData.push_back(data);
        return;
    }

    asyncWriteBlock(data);
}